

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkeng.cpp
# Opt level: O3

DictionaryMatcher * __thiscall
icu_63::ICULanguageBreakFactory::loadDictionaryMatcherFor
          (ICULanguageBreakFactory *this,UScriptCode script)

{
  int iVar1;
  int iVar2;
  UResourceBundle *pUVar3;
  char *inKey;
  UChar *s;
  UChar *pUVar4;
  UDataMemory *pData;
  int *piVar5;
  DictionaryMatcher *pDVar6;
  uint uVar7;
  UErrorCode status;
  int32_t dictnlength;
  CharString ext;
  CharString dictnbuf;
  UErrorCode local_120;
  uint local_11c;
  ConstChar16Ptr local_118;
  ConstChar16Ptr local_110;
  UChar *local_108;
  UChar *local_f8;
  UnicodeString local_e8;
  CharString local_a8;
  CharString local_68;
  
  local_120 = U_ZERO_ERROR;
  pUVar3 = ures_open_63("icudt63l-brkitr","",&local_120);
  pUVar3 = ures_getByKeyWithFallback_63(pUVar3,"dictionaries",pUVar3,&local_120);
  local_11c = 0;
  inKey = uscript_getShortName_63(script);
  s = ures_getStringByKeyWithFallback_63(pUVar3,inKey,(int32_t *)&local_11c,&local_120);
  if (U_ZERO_ERROR < local_120) {
    ures_close_63(pUVar3);
    return (DictionaryMatcher *)0x0;
  }
  MaybeStackArray<char,_40>::MaybeStackArray(&local_68.buffer);
  local_68.len = 0;
  *local_68.buffer.ptr = '\0';
  MaybeStackArray<char,_40>::MaybeStackArray(&local_a8.buffer);
  local_a8.len = 0;
  *local_a8.buffer.ptr = '\0';
  pUVar4 = u_memrchr_63(s,L'.',local_11c);
  if (pUVar4 != (UChar *)0x0) {
    local_110.p_ = pUVar4 + 1;
    uVar7 = (uint)((ulong)((long)pUVar4 - (long)s) >> 1);
    UnicodeString::UnicodeString(&local_e8,'\0',&local_110,local_11c + ~uVar7);
    CharString::appendInvariantChars(&local_a8,&local_e8,&local_120);
    UnicodeString::~UnicodeString(&local_e8);
    local_f8 = local_110.p_;
    local_11c = uVar7;
  }
  local_118.p_ = s;
  UnicodeString::UnicodeString(&local_e8,'\0',&local_118,local_11c);
  CharString::appendInvariantChars(&local_68,&local_e8,&local_120);
  UnicodeString::~UnicodeString(&local_e8);
  local_108 = local_118.p_;
  ures_close_63(pUVar3);
  pData = udata_open_63("icudt63l-brkitr",local_a8.buffer.ptr,local_68.buffer.ptr,&local_120);
  if (local_120 < U_ILLEGAL_ARGUMENT_ERROR) {
    piVar5 = (int *)udata_getMemory_63(pData);
    iVar1 = *piVar5;
    if ((piVar5[4] & 7U) == 0) {
      iVar2 = piVar5[5];
      pDVar6 = (DictionaryMatcher *)
               UMemory::operator_new((UMemory *)0x20,(size_t)local_a8.buffer.ptr);
      if (pDVar6 != (DictionaryMatcher *)0x0) {
        pDVar6->_vptr_DictionaryMatcher = (_func_int **)&PTR__BytesDictionaryMatcher_003b3dd8;
        pDVar6[1]._vptr_DictionaryMatcher = (_func_int **)((long)piVar5 + (long)iVar1);
        *(int *)&pDVar6[2]._vptr_DictionaryMatcher = iVar2;
        pDVar6[3]._vptr_DictionaryMatcher = (_func_int **)pData;
        goto LAB_002dd884;
      }
    }
    else if (((piVar5[4] & 7U) == 1) &&
            (pDVar6 = (DictionaryMatcher *)
                      UMemory::operator_new((UMemory *)0x18,(size_t)local_a8.buffer.ptr),
            pDVar6 != (DictionaryMatcher *)0x0)) {
      pDVar6->_vptr_DictionaryMatcher = (_func_int **)&PTR__UCharsDictionaryMatcher_003b3da8;
      pDVar6[1]._vptr_DictionaryMatcher = (_func_int **)((long)piVar5 + (long)iVar1);
      pDVar6[2]._vptr_DictionaryMatcher = (_func_int **)pData;
      goto LAB_002dd884;
    }
    udata_close_63(pData);
  }
  else if (s != (UChar *)0x0) {
    local_120 = U_ZERO_ERROR;
  }
  pDVar6 = (DictionaryMatcher *)0x0;
LAB_002dd884:
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_a8.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_68.buffer);
  return pDVar6;
}

Assistant:

DictionaryMatcher *
ICULanguageBreakFactory::loadDictionaryMatcherFor(UScriptCode script) { 
    UErrorCode status = U_ZERO_ERROR;
    // open root from brkitr tree.
    UResourceBundle *b = ures_open(U_ICUDATA_BRKITR, "", &status);
    b = ures_getByKeyWithFallback(b, "dictionaries", b, &status);
    int32_t dictnlength = 0;
    const UChar *dictfname =
        ures_getStringByKeyWithFallback(b, uscript_getShortName(script), &dictnlength, &status);
    if (U_FAILURE(status)) {
        ures_close(b);
        return NULL;
    }
    CharString dictnbuf;
    CharString ext;
    const UChar *extStart = u_memrchr(dictfname, 0x002e, dictnlength);  // last dot
    if (extStart != NULL) {
        int32_t len = (int32_t)(extStart - dictfname);
        ext.appendInvariantChars(UnicodeString(FALSE, extStart + 1, dictnlength - len - 1), status);
        dictnlength = len;
    }
    dictnbuf.appendInvariantChars(UnicodeString(FALSE, dictfname, dictnlength), status);
    ures_close(b);

    UDataMemory *file = udata_open(U_ICUDATA_BRKITR, ext.data(), dictnbuf.data(), &status);
    if (U_SUCCESS(status)) {
        // build trie
        const uint8_t *data = (const uint8_t *)udata_getMemory(file);
        const int32_t *indexes = (const int32_t *)data;
        const int32_t offset = indexes[DictionaryData::IX_STRING_TRIE_OFFSET];
        const int32_t trieType = indexes[DictionaryData::IX_TRIE_TYPE] & DictionaryData::TRIE_TYPE_MASK;
        DictionaryMatcher *m = NULL;
        if (trieType == DictionaryData::TRIE_TYPE_BYTES) {
            const int32_t transform = indexes[DictionaryData::IX_TRANSFORM];
            const char *characters = (const char *)(data + offset);
            m = new BytesDictionaryMatcher(characters, transform, file);
        }
        else if (trieType == DictionaryData::TRIE_TYPE_UCHARS) {
            const UChar *characters = (const UChar *)(data + offset);
            m = new UCharsDictionaryMatcher(characters, file);
        }
        if (m == NULL) {
            // no matcher exists to take ownership - either we are an invalid 
            // type or memory allocation failed
            udata_close(file);
        }
        return m;
    } else if (dictfname != NULL) {
        // we don't have a dictionary matcher.
        // returning NULL here will cause us to fail to find a dictionary break engine, as expected
        status = U_ZERO_ERROR;
        return NULL;
    }
    return NULL;
}